

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_collection.cpp
# Opt level: O1

void __thiscall
duckdb::ColumnDataCollection::ColumnDataCollection
          (ColumnDataCollection *this,shared_ptr<duckdb::ColumnDataAllocator,_true> *allocator_p,
          vector<duckdb::LogicalType,_true> *types_p)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_48;
  
  (this->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->allocator).internal.
  super___shared_ptr<duckdb::ColumnDataAllocator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->allocator).internal.
  super___shared_ptr<duckdb::ColumnDataAllocator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->segments).
  super_vector<duckdb::unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->segments).
  super_vector<duckdb::unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->segments).
  super_vector<duckdb::unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->copy_functions).
  super_vector<duckdb::ColumnDataCopyFunction,_std::allocator<duckdb::ColumnDataCopyFunction>_>.
  super__Vector_base<duckdb::ColumnDataCopyFunction,_std::allocator<duckdb::ColumnDataCopyFunction>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->copy_functions).
  super_vector<duckdb::ColumnDataCopyFunction,_std::allocator<duckdb::ColumnDataCopyFunction>_>.
  super__Vector_base<duckdb::ColumnDataCopyFunction,_std::allocator<duckdb::ColumnDataCopyFunction>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->copy_functions).
  super_vector<duckdb::ColumnDataCopyFunction,_std::allocator<duckdb::ColumnDataCopyFunction>_>.
  super__Vector_base<duckdb::ColumnDataCopyFunction,_std::allocator<duckdb::ColumnDataCopyFunction>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->partition_index).index = 0xffffffffffffffff;
  local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start =
       (types_p->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (types_p->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (types_p->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (types_p->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (types_p->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (types_p->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  Initialize(this,(vector<duckdb::LogicalType,_true> *)&local_48);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_48);
  peVar1 = (allocator_p->internal).
           super___shared_ptr<duckdb::ColumnDataAllocator,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (allocator_p->internal).
           super___shared_ptr<duckdb::ColumnDataAllocator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (allocator_p->internal).
  super___shared_ptr<duckdb::ColumnDataAllocator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (allocator_p->internal).
  super___shared_ptr<duckdb::ColumnDataAllocator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->allocator).internal.
            super___shared_ptr<duckdb::ColumnDataAllocator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  (this->allocator).internal.
  super___shared_ptr<duckdb::ColumnDataAllocator,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  (this->allocator).internal.
  super___shared_ptr<duckdb::ColumnDataAllocator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

ColumnDataCollection::ColumnDataCollection(shared_ptr<ColumnDataAllocator> allocator_p, vector<LogicalType> types_p) {
	Initialize(std::move(types_p));
	this->allocator = std::move(allocator_p);
}